

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void CCommandLineOptions::printHelp(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,"refal2");
  poVar1 = std::operator<<(poVar1," [OPTION]... [FILE]...");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  -c, --check      check source FILE(s) for errors and exit");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"      --help       display this help and exit");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"      --version    output version information and exit");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"Report bugs to <refal2@yandex.ru>.");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void CCommandLineOptions::printHelp()
{
	std::cout
		<< "Usage: " << UtilityName << " [OPTION]... [FILE]..."
		<< std::endl << std::endl
		<< "  -c, --check      check source FILE(s) for errors and exit"
		<< std::endl
		<< "      --help       display this help and exit" << std::endl
		<< "      --version    output version information and exit"
		<< std::endl << std::endl << "Report bugs to <refal2@yandex.ru>."
		<< std::endl;
}